

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.c
# Opt level: O0

RewindStats * rewind_get_stats(RewindStats *__return_storage_ptr__,RewindBuffer *buffer)

{
  u8 *puVar1;
  RewindDataRange *pRVar2;
  RewindInfoRange *pRVar3;
  RewindStats *stats;
  RewindInfoRange *info_range;
  RewindDataRange *data_range;
  int i;
  u8 *begin;
  RewindBuffer *buffer_local;
  
  memset(__return_storage_ptr__,0,0x68);
  __return_storage_ptr__->base_bytes = buffer->total_kind_bytes[0];
  __return_storage_ptr__->diff_bytes = buffer->total_kind_bytes[1];
  __return_storage_ptr__->uncompressed_bytes = buffer->total_uncompressed_bytes;
  __return_storage_ptr__->used_bytes = 0;
  __return_storage_ptr__->capacity_bytes = (buffer->init).buffer_capacity;
  puVar1 = buffer->data_range[0].begin;
  for (data_range._4_4_ = 0; data_range._4_4_ < 2; data_range._4_4_ = data_range._4_4_ + 1) {
    pRVar2 = buffer->data_range + data_range._4_4_;
    pRVar3 = buffer->info_range + data_range._4_4_;
    __return_storage_ptr__->used_bytes =
         (size_t)(pRVar2->end + (__return_storage_ptr__->used_bytes - (long)pRVar2->begin));
    __return_storage_ptr__->used_bytes =
         ((long)pRVar3->end - (long)pRVar3->begin >> 5) * 0x20 + __return_storage_ptr__->used_bytes;
    __return_storage_ptr__->data_ranges[data_range._4_4_ << 1] = (long)pRVar2->begin - (long)puVar1;
    __return_storage_ptr__->data_ranges[data_range._4_4_ * 2 + 1] = (long)pRVar2->end - (long)puVar1
    ;
    __return_storage_ptr__->info_ranges[data_range._4_4_ << 1] = (long)pRVar3->begin - (long)puVar1;
    __return_storage_ptr__->info_ranges[data_range._4_4_ * 2 + 1] = (long)pRVar3->end - (long)puVar1
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

RewindStats rewind_get_stats(RewindBuffer* buffer) {
  RewindStats stats;
  ZERO_MEMORY(stats);
  stats.base_bytes = buffer->total_kind_bytes[RewindInfoKind_Base];
  stats.diff_bytes = buffer->total_kind_bytes[RewindInfoKind_Diff];
  stats.uncompressed_bytes = buffer->total_uncompressed_bytes;
  stats.used_bytes = 0;
  stats.capacity_bytes = buffer->init.buffer_capacity;

  u8* begin = buffer->data_range[0].begin;
  int i;
  for (i = 0; i < 2; ++i) {
    RewindDataRange* data_range = &buffer->data_range[i];
    RewindInfoRange* info_range = &buffer->info_range[i];
    stats.used_bytes += data_range->end - data_range->begin;
    stats.used_bytes +=
        (info_range->end - info_range->begin) * sizeof(RewindInfo);

    stats.data_ranges[i*2+0] = data_range->begin - begin;
    stats.data_ranges[i*2+1] = data_range->end - begin;
    stats.info_ranges[i*2+0] = (u8*)info_range->begin - begin;
    stats.info_ranges[i*2+1] = (u8*)info_range->end - begin;
  }

  return stats;
}